

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

int32_t ymfm::opn_lfo_pm_phase_adjustment
                  (uint32_t fnum_bits,uint32_t pm_sensitivity,int32_t lfo_raw_pm)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int local_3c;
  uint32_t local_24;
  int local_20;
  int32_t adjust;
  uint32_t shifts;
  int32_t abs_pm;
  int32_t lfo_raw_pm_local;
  uint32_t pm_sensitivity_local;
  uint32_t fnum_bits_local;
  
  local_24 = lfo_raw_pm;
  if (lfo_raw_pm < 0) {
    local_24 = -lfo_raw_pm;
  }
  uVar2 = bitfield(local_24,0,3);
  bVar1 = opn_lfo_pm_phase_adjustment::s_lfo_pm_shifts[pm_sensitivity][uVar2];
  uVar2 = bitfield((uint)bVar1,0,4);
  uVar3 = bitfield((uint)bVar1,4,4);
  local_20 = (fnum_bits >> ((byte)uVar2 & 0x1f)) + (fnum_bits >> ((byte)uVar3 & 0x1f));
  if (5 < pm_sensitivity) {
    local_20 = local_20 << ((char)pm_sensitivity - 5U & 0x1f);
  }
  local_3c = local_20 >> 2;
  if (lfo_raw_pm < 0) {
    local_3c = -local_3c;
  }
  return local_3c;
}

Assistant:

inline int32_t opn_lfo_pm_phase_adjustment(uint32_t fnum_bits, uint32_t pm_sensitivity, int32_t lfo_raw_pm)
{
	// this table encodes 2 shift values to apply to the top 7 bits
	// of fnum; it is effectively a cheap multiply by a constant
	// value containing 0-2 bits
	static uint8_t const s_lfo_pm_shifts[8][8] =
	{
		{ 0x77, 0x77, 0x77, 0x77, 0x77, 0x77, 0x77, 0x77 },
		{ 0x77, 0x77, 0x77, 0x77, 0x72, 0x72, 0x72, 0x72 },
		{ 0x77, 0x77, 0x77, 0x72, 0x72, 0x72, 0x17, 0x17 },
		{ 0x77, 0x77, 0x72, 0x72, 0x17, 0x17, 0x12, 0x12 },
		{ 0x77, 0x77, 0x72, 0x17, 0x17, 0x17, 0x12, 0x07 },
		{ 0x77, 0x77, 0x17, 0x12, 0x07, 0x07, 0x02, 0x01 },
		{ 0x77, 0x77, 0x17, 0x12, 0x07, 0x07, 0x02, 0x01 },
		{ 0x77, 0x77, 0x17, 0x12, 0x07, 0x07, 0x02, 0x01 }
	};

	// look up the relevant shifts
	int32_t abs_pm = (lfo_raw_pm < 0) ? -lfo_raw_pm : lfo_raw_pm;
	uint32_t const shifts = s_lfo_pm_shifts[pm_sensitivity][bitfield(abs_pm, 0, 3)];

	// compute the adjustment
	int32_t adjust = (fnum_bits >> bitfield(shifts, 0, 4)) + (fnum_bits >> bitfield(shifts, 4, 4));
	if (pm_sensitivity > 5)
		adjust <<= pm_sensitivity - 5;
	adjust >>= 2;

	// every 16 cycles it inverts sign
	return (lfo_raw_pm < 0) ? -adjust : adjust;
}